

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void YM2612_End(ym2612_ *YM2612)

{
  free(YM2612);
  return;
}

Assistant:

void YM2612_End(ym2612_ *YM2612)
{
  free(YM2612);

#if YM_DEBUG_LEVEL > 0
  if (debug_file)
    fclose(debug_file);
  debug_file = NULL;
#endif

  return;
}